

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void bam_aux_append(bam1_t *b,char *tag,char type,int len,uint8_t *data)

{
  int iVar1;
  uint8_t *puVar2;
  int ori_len;
  uint8_t *data_local;
  int len_local;
  char type_local;
  char *tag_local;
  bam1_t *b_local;
  
  iVar1 = b->l_data;
  b->l_data = len + 3 + b->l_data;
  if (b->m_data < b->l_data) {
    b->m_data = b->l_data;
    b->m_data = b->m_data + -1;
    b->m_data = b->m_data >> 1 | b->m_data;
    b->m_data = b->m_data >> 2 | b->m_data;
    b->m_data = b->m_data >> 4 | b->m_data;
    b->m_data = b->m_data >> 8 | b->m_data;
    b->m_data = b->m_data >> 0x10 | b->m_data;
    b->m_data = b->m_data + 1;
    puVar2 = (uint8_t *)realloc(b->data,(long)b->m_data);
    b->data = puVar2;
  }
  b->data[iVar1] = *tag;
  b->data[iVar1 + 1] = tag[1];
  b->data[iVar1 + 2] = type;
  memcpy(b->data + (long)iVar1 + 3,data,(long)len);
  return;
}

Assistant:

void bam_aux_append(bam1_t *b, const char tag[2], char type, int len, uint8_t *data)
{
    int ori_len = b->l_data;
    b->l_data += 3 + len;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
    }
    b->data[ori_len] = tag[0]; b->data[ori_len + 1] = tag[1];
    b->data[ori_len + 2] = type;
    memcpy(b->data + ori_len + 3, data, len);
}